

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::markchunk(ImgfsFile *this,uint64_t ofs,uint size,chunktype_t type)

{
  uint uVar1;
  uint64_t uVar2;
  int iVar3;
  string *psVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar7;
  size_type sVar8;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  __first;
  undefined8 uVar9;
  bool local_119;
  string local_a0 [8];
  string str;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  local_68;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  local_60;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  local_58;
  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
  local_50;
  iterator end;
  iterator begin;
  uint n;
  uint ix;
  chunktype_t local_1d;
  uint local_1c;
  chunktype_t type_local;
  uint64_t uStack_18;
  uint size_local;
  uint64_t ofs_local;
  ImgfsFile *this_local;
  
  local_1d = type;
  local_1c = size;
  uStack_18 = ofs;
  ofs_local = (uint64_t)this;
  if (size == 0) {
    psVar4 = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_
              (psVar4,"can\'t mark empty chunk @%08llx, \'%c\'",uStack_18,
               (ulong)(uint)(int)(char)local_1d);
    __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->_rd);
  iVar3 = (*peVar5->_vptr_ReadWriter[6])();
  if (ofs < CONCAT44(extraout_var,iVar3)) {
    uVar6 = uStack_18 + local_1c;
    peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_rd);
    iVar3 = (*peVar5->_vptr_ReadWriter[6])();
    if (uVar6 <= CONCAT44(extraout_var_00,iVar3)) {
      if (uStack_18 % (ulong)(this->_hdr).bytesperchunk != 0) {
        psVar4 = (string *)__cxa_allocate_exception(0x20);
        stringformat_abi_cxx11_(psVar4,"unaligned chunk @%08llx",uStack_18);
        __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      local_1c = roundtochunk(this,local_1c);
      if (uStack_18 / (this->_hdr).bytesperchunk >> 0x20 == 0) {
        uVar6 = uStack_18 / (this->_hdr).bytesperchunk;
        begin._M_current._4_4_ = local_1c / (this->_hdr).bytesperchunk;
        sVar8 = std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::size
                          (&this->_chunkmap);
        if (sVar8 < (int)uVar6 + begin._M_current._4_4_) {
          begin._M_current._3_1_ = 0x20;
          std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::resize
                    (&this->_chunkmap,(ulong)((int)uVar6 + begin._M_current._4_4_),
                     (value_type *)((long)&begin._M_current + 3));
        }
        end = std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::begin
                        (&this->_chunkmap);
        __first = __gnu_cxx::
                  __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                  ::operator+(&end,uVar6 & 0xffffffff);
        local_60._M_current =
             (chunktype_t *)
             std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>::begin
                       (&this->_chunkmap);
        local_58 = __gnu_cxx::
                   __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                   ::operator+(&local_60,uVar6 & 0xffffffff);
        local_50 = __gnu_cxx::
                   __normal_iterator<ImgfsFile::chunktype_t_*,_std::vector<ImgfsFile::chunktype_t,_std::allocator<ImgfsFile::chunktype_t>_>_>
                   ::operator+(&local_58,(ulong)begin._M_current._4_4_);
        local_119 = false;
        if (local_1d != FREECHUNK) {
          local_68 = std::
                     find_if<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,ImgfsFile::markchunk(unsigned_long,unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_1_>
                               (__first._M_current,local_50._M_current);
          local_119 = __gnu_cxx::operator!=(&local_68,&local_50);
        }
        if (local_119 != false) {
          printf("markchunk, n=%d, type=%c\n",(ulong)begin._M_current._4_4_,
                 (ulong)(uint)(int)(char)local_1d);
          std::__cxx11::string::string(local_a0);
          std::
          for_each<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,ImgfsFile::markchunk(unsigned_long,unsigned_int,ImgfsFile::chunktype_t)::_lambda(ImgfsFile::chunktype_t)_2_>
                    (__first,local_50,(string *)local_a0);
          uVar6 = uStack_18;
          uVar1 = local_1c;
          uVar9 = std::__cxx11::string::c_str();
          printf("chunk %08llx+%08x is already: \'%s\'\n",uVar6,(ulong)uVar1,uVar9);
          std::__cxx11::string::~string(local_a0);
        }
        std::
        fill_n<__gnu_cxx::__normal_iterator<ImgfsFile::chunktype_t*,std::vector<ImgfsFile::chunktype_t,std::allocator<ImgfsFile::chunktype_t>>>,unsigned_int,ImgfsFile::chunktype_t>
                  (__first,begin._M_current._4_4_,&local_1d);
        return;
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "markchunk: offset too large";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
  }
  psVar4 = (string *)__cxa_allocate_exception(0x20);
  uVar2 = uStack_18;
  uVar1 = local_1c;
  peVar5 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->_rd);
  iVar3 = (*peVar5->_vptr_ReadWriter[6])();
  stringformat_abi_cxx11_
            (psVar4,"chunk @%08llx+%08x outside of file [filesize=%llx]",uVar2,(ulong)uVar1,
             CONCAT44(extraout_var_01,iVar3));
  __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void markchunk(uint64_t ofs, unsigned size, chunktype_t type)
    {
        if (size==0)
            throw stringformat("can't mark empty chunk @%08llx, '%c'", ofs, type);
        if (ofs>=_rd->size() || ofs+size > _rd->size())
            throw stringformat("chunk @%08llx+%08x outside of file [filesize=%llx]", ofs, size, _rd->size());
        if (ofs%_hdr.bytesperchunk)
            throw stringformat("unaligned chunk @%08llx", ofs);

        size= roundtochunk(size);

        if ((ofs/_hdr.bytesperchunk)>>32)
            throw "markchunk: offset too large";
        unsigned ix= unsigned(ofs/_hdr.bytesperchunk);
        unsigned n= size/_hdr.bytesperchunk;
        if (_chunkmap.size()<ix+n)
            _chunkmap.resize(ix+n, FREECHUNK);

        chunkmap_t::iterator begin= _chunkmap.begin()+ix;
        chunkmap_t::iterator end= _chunkmap.begin()+ix+n;

        // note: msvc10 requires the explicit class scope ImgfsFile  for FREECHUNK
        if (type!=FREECHUNK && std::find_if(begin, end, [](chunktype_t t) { return t!=ImgfsFile::FREECHUNK; })!=end) {
            printf("markchunk, n=%d, type=%c\n", n, type);
            std::string str;
            std::for_each(begin, end, [&str](chunktype_t t){ str += (char)t; });
            printf("chunk %08llx+%08x is already: '%s'\n", ofs, size, str.c_str());

            // is 'str' correct, while the string below is not,
            //    -> because i did not declare the enum as ':char'
            //printf("chunk %08llx+%08x is already: '%s'\n", ofs, size, std::string((const char*)&(*begin), n).c_str());
        }
        std::fill_n(begin, n, type);
    }